

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O2

void opn2_setLoopEndHook(OPN2_MIDIPlayer *device,OPN2_LoopPointHook loopEndHook,void *userData)

{
  void *pvVar1;
  
  if (device != (OPN2_MIDIPlayer *)0x0) {
    pvVar1 = device->opn2_midiPlayer;
    if (pvVar1 == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x3e9,
                    "void opn2_setLoopEndHook(struct OPN2_MIDIPlayer *, OPN2_LoopPointHook, void *)"
                   );
    }
    *(OPN2_LoopPointHook *)((long)pvVar1 + 0x40) = loopEndHook;
    *(void **)((long)pvVar1 + 0x48) = userData;
  }
  return;
}

Assistant:

OPNMIDI_EXPORT void opn2_setLoopEndHook(struct OPN2_MIDIPlayer *device, OPN2_LoopPointHook loopEndHook, void *userData)
{
    if(!device)
        return;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    play->hooks.onLoopEnd = loopEndHook;
    play->hooks.onLoopEnd_userData = userData;
#ifndef OPNMIDI_DISABLE_MIDI_SEQUENCER
    play->m_sequencerInterface->onloopEnd = loopEndHook;
    play->m_sequencerInterface->onloopEnd_userData = userData;
#endif
}